

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

btScalar __thiscall btSoftBody::getTotalMass(btSoftBody *this)

{
  float fVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  
  lVar2 = (long)(this->m_nodes).m_size;
  if (0 < lVar2) {
    fVar4 = 0.0;
    lVar3 = 0;
    do {
      fVar1 = *(float *)((long)(&((this->m_nodes).m_data)->m_n + 1) + lVar3);
      fVar4 = fVar4 + (float)(-(uint)(0.0 < fVar1) & (uint)(1.0 / fVar1));
      lVar3 = lVar3 + 0x78;
    } while (lVar2 * 0x78 - lVar3 != 0);
    return fVar4;
  }
  return 0.0;
}

Assistant:

btScalar		btSoftBody::getTotalMass() const
{
	btScalar	mass=0;
	for(int i=0;i<m_nodes.size();++i)
	{
		mass+=getMass(i);
	}
	return(mass);
}